

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O3

void __thiscall orphanage_tests::same_txid_diff_witness::test_method(same_txid_diff_witness *this)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer pCVar3;
  readonly_property<bool> rVar4;
  bool bVar5;
  int iVar6;
  iterator in_R8;
  iterator pvVar7;
  allocator_type *__a;
  iterator in_R9;
  iterator pvVar8;
  Wtxid *wtxid;
  long lVar9;
  Wtxid *wtxid_00;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  initializer_list<COutPoint> __l;
  initializer_list<unsigned_char> __l_00;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  CTransactionRef child_mutated;
  CTransactionRef child_normal;
  CTransactionRef parent;
  vector<COutPoint,_std::allocator<COutPoint>_> empty_outpoints;
  TxOrphanage orphanage;
  FastRandomContext det_rand;
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  expected_children;
  check_type cVar15;
  char *pcVar14;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  undefined4 local_464;
  assertion_result local_460;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  int local_2fc;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  CTransactionRef local_278;
  CTransactionRef local_268;
  CTransactionRef local_258;
  undefined1 local_248 [16];
  pointer local_238;
  undefined4 *local_228;
  int *local_220;
  undefined1 local_218 [16];
  assertion_result local_208;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [8];
  shared_count asStack_1e0 [2];
  undefined1 local_1d0 [144];
  pointer p_Stack_140;
  undefined1 local_138 [16];
  NodeSeconds local_128;
  FastRandomContext local_120;
  CMutableTransaction local_98;
  undefined8 uStack_60;
  assertion_result local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long local_38;
  
  local_208.m_message.pn.pi_ = (sp_counted_base *)local_208.m_message.px;
  asStack_1e0[0].pi_ = (sp_counted_base *)local_1e8;
  local_58.m_message.pn.pi_ = (sp_counted_base *)local_58.m_message.px;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&local_120,true);
  local_1d0._24_8_ = local_1d0 + 8;
  local_1d0._8_4_ = _S_red;
  local_1d0._16_8_ = (_Base_ptr)0x0;
  local_1d0._40_8_ = 0;
  local_1d0._72_8_ = local_1d0 + 0x38;
  local_1d0._56_4_ = _S_red;
  local_1d0._64_8_ = (_Base_ptr)0x0;
  local_1d0._88_8_ = 0;
  local_1d0._120_8_ = local_1d0 + 0x68;
  local_1d0._104_4_ = _S_red;
  local_1d0._112_8_ = (_Base_ptr)0x0;
  stack0xfffffffffffffeb8 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_128.__d.__r = (duration)0;
  local_238 = (pointer)0x0;
  local_248 = (undefined1  [16])0x0;
  local_1d0._32_8_ = local_1d0._24_8_;
  local_1d0._80_8_ = local_1d0._72_8_;
  local_1d0._128_8_ = local_1d0._120_8_;
  MakeTransactionSpending
            ((orphanage_tests *)&local_258,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)local_248,&local_120);
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)
              ((local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)
               (((local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       *(pointer *)
        (((local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)
              (((local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_98;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&local_58,__l,
             (allocator_type *)local_1f0);
  MakeTransactionSpending
            ((orphanage_tests *)&local_268,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&local_58,&local_120);
  if ((void *)local_58._0_8_ != (void *)0x0) {
    operator_delete((void *)local_58._0_8_,(long)local_58.m_message.pn.pi_ - local_58._0_8_);
  }
  CMutableTransaction::CMutableTransaction
            (&local_98,
             local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pCVar3 = local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1f0[0] = (class_property<bool>)true;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,__l_00,
             (allocator_type *)&local_460);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&pCVar3->scriptWitness,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  if ((void *)local_58._0_8_ != (void *)0x0) {
    operator_delete((void *)local_58._0_8_,(long)local_58.m_message.pn.pi_ - local_58._0_8_);
  }
  local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&local_278,(allocator<CTransaction> *)&local_58,&local_98
            );
  auVar12[0] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar12[1] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar12[2] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar12[3] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar12[4] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar12[5] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar12[6] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar12[7] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar12[8] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar12[9] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar12[10] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar12[0xb] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar12[0xc] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar12[0xd] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar12[0xe] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar12[0xf] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar10[0] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar10[1] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar10[2] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar10[3] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar10[4] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar10[5] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar10[6] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar10[7] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar10[8] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar10[9] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar10[10] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar10[0xb] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar10[0xc] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar10[0xd] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar10[0xe] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar10[0xf] = -(((local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  ((local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar10 = auVar10 & auVar12;
  if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("ptx->GetHash() == mutated_tx->GetHash()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
                  ,0x54,"CTransactionRef orphanage_tests::MakeMutation(const CTransactionRef &)");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_98.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_98.vin);
  peVar2 = local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1 = local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xf7;
  file.m_begin = (iterator)&local_288;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_298,msg);
  wtxid_00 = &peVar2->m_witness_hash;
  wtxid = &peVar1->m_witness_hash;
  auVar10 = *(undefined1 (*) [16])
             ((peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  auVar13[0] = -((wtxid->m_wrapped).super_base_blob<256U>.m_data._M_elems[0] ==
                (wtxid_00->m_wrapped).super_base_blob<256U>.m_data._M_elems[0]);
  auVar13[1] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar13[2] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar13[3] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar13[4] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar13[5] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar13[6] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar13[7] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar13[8] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar13[9] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar13[10] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar13[0xb] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar13[0xc] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar13[0xd] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar13[0xe] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar13[0xf] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  (peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar11[0] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                auVar10[0]);
  auVar11[1] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                auVar10[1]);
  auVar11[2] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                auVar10[2]);
  auVar11[3] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                auVar10[3]);
  auVar11[4] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                auVar10[4]);
  auVar11[5] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                auVar10[5]);
  auVar11[6] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                auVar10[6]);
  auVar11[7] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                auVar10[7]);
  auVar11[8] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                auVar10[8]);
  auVar11[9] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                auVar10[9]);
  auVar11[10] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 auVar10[10]);
  auVar11[0xb] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  auVar10[0xb]);
  auVar11[0xc] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  auVar10[0xc]);
  auVar11[0xd] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  auVar10[0xd]);
  auVar11[0xe] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  auVar10[0xe]);
  auVar11[0xf] = -((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  auVar10[0xf]);
  auVar11 = auVar11 & auVar13;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined1  [8])0xec0488;
  local_1e8 = (undefined1  [8])0xec04a5;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2a0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f0;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff);
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)&local_98,1,0,WARN,_cVar15,(size_t)&local_2a8,0xf7);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xf9;
  file_00.m_begin = (iterator)&local_2b8;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2c8,
             msg_00);
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TxOrphanage::AddTx((TxOrphanage *)local_1d0,&local_268,0);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined1  [8])0xec04a6;
  local_1e8 = (undefined1  [8])"";
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2d0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)&local_98,1,0,WARN,_cVar15,(size_t)&local_2d8,0xf9);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xfb;
  file_01.m_begin = (iterator)&local_2e8;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2f8,
             msg_01);
  local_1e8 = (undefined1  [8])(local_1e8._1_8_ << 8);
  local_1f0 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  asStack_1e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_1e0[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
  iVar6 = TxOrphanage::EraseTx((TxOrphanage *)local_1d0,wtxid);
  local_218._0_8_ = &local_228;
  local_228 = (undefined4 *)CONCAT44(local_228._4_4_,iVar6);
  local_220 = &local_2fc;
  local_460.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar6 == 0);
  local_2fc = 0;
  local_460.m_message.px = (element_type *)0x0;
  local_460.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_208._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_208.m_message.px = (element_type *)0xec034c;
  local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_218;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae248;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_220;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013ae248;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar14 = "orphanage.EraseTx(mutated_wtxid)";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_460,(lazy_ostream *)local_1f0,1,2,REQUIRE,0xec04ca,(size_t)&local_208,0xfb,
             &local_98,"0",&local_58);
  boost::detail::shared_count::~shared_count(&local_460.m_message.pn);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xfc;
  file_02.m_begin = (iterator)&local_310;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_320,
             msg_02);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)TxOrphanage::HaveTx((TxOrphanage *)local_1d0,wtxid_00);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined1  [8])0xec05a0;
  local_1e8 = (undefined1  [8])0xec05be;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_328 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f0;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)&local_98,1,0,WARN,(check_type)pcVar14,(size_t)&local_330,
             0xfc);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xfd;
  file_03.m_begin = (iterator)&local_340;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_350,
             msg_03);
  bVar5 = TxOrphanage::HaveTx((TxOrphanage *)local_1d0,wtxid);
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar5;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined1  [8])0xec04eb;
  local_1e8 = (undefined1  [8])0xec050b;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_358 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)&local_98,1,0,WARN,(check_type)pcVar14,(size_t)&local_360,
             0xfd);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x100;
  file_04.m_begin = (iterator)&local_370;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_380,
             msg_04);
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TxOrphanage::AddTx((TxOrphanage *)local_1d0,&local_278,0);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined1  [8])0xec050c;
  local_1e8 = (undefined1  [8])0xec0530;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_388 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)&local_98,1,0,WARN,(check_type)pcVar14,(size_t)&local_390,
             0x100);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x101;
  file_05.m_begin = (iterator)&local_3a0;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3b0,
             msg_05);
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TxOrphanage::HaveTx((TxOrphanage *)local_1d0,wtxid_00);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined1  [8])0xec05a0;
  local_1e8 = (undefined1  [8])0xec05be;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3b8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)&local_98,1,0,WARN,(check_type)pcVar14,(size_t)&local_3c0,
             0x101);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x102;
  file_06.m_begin = (iterator)&local_3d0;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3e0,
             msg_06);
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TxOrphanage::HaveTx((TxOrphanage *)local_1d0,wtxid);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined1  [8])0xec04ec;
  local_1e8 = (undefined1  [8])"";
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3e8 = "";
  pvVar7 = (iterator)0x0;
  local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)&local_98,1,0,WARN,(check_type)pcVar14,(size_t)&local_3f0,
             0x102);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  local_58._0_8_ =
       local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((element_type *)
      local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_58.m_message.pn.pi_ =
       (sp_counted_base *)
       local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.m_message.px =
       (element_type *)
       local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  local_40 = local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  __a = (allocator_type *)&local_460;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_58;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)&local_98,__l_01,(less<std::shared_ptr<const_CTransaction>_> *)local_1f0,__a);
  lVar9 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_60 + lVar9) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_60 + lVar9));
    }
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != 0);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x106;
  file_07.m_begin = (iterator)&local_400;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = (iterator)__a;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_410,
             msg_07);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&local_460,(TxOrphanage *)local_1d0,&local_258,0);
  bVar5 = EqualTxns((orphanage_tests *)&local_98,
                    (set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)local_460._0_8_,
                    (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)local_460.m_message.px);
  local_1f0[0] = (class_property<bool>)(class_property<bool>)bVar5;
  _local_1e8 = (undefined1  [16])0x0;
  local_208._0_8_ = "EqualTxns(expected_children, orphanage.GetChildrenFromSamePeer(parent, peer))";
  local_208.m_message.px = (element_type *)0xec057e;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_208;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_418 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_58,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_420,0x106);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 8));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_460);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x109;
  file_08.m_begin = (iterator)&local_430;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_440,
             msg_08);
  local_460.m_message.px = (element_type *)(local_460.m_message._1_8_ << 8);
  local_460._0_8_ = &PTR__lazy_ostream_013ae088;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = "";
  local_2fc = TxOrphanage::EraseTx((TxOrphanage *)local_1d0,wtxid);
  local_228 = &local_464;
  local_464 = 1;
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_218._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_218._8_8_ = "";
  local_220 = &local_2fc;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013ae248;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_220;
  local_1e8 = (undefined1  [8])(local_1e8._1_8_ << 8);
  local_1f0 = (undefined1  [8])&PTR__lazy_ostream_013ae248;
  asStack_1e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_1e0[1].pi_ = (sp_counted_base *)&local_228;
  pcVar14 = "orphanage.EraseTx(mutated_wtxid)";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_208.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_2fc == 1);
  boost::test_tools::tt_detail::report_assertion
            (&local_208,(lazy_ostream *)&local_460,1,2,REQUIRE,0xec04ca,(size_t)local_218,0x109,
             &local_58,"1",(assertion_result *)local_1f0);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x10a;
  file_09.m_begin = (iterator)&local_478;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_488,
             msg_09);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)TxOrphanage::HaveTx((TxOrphanage *)local_1d0,wtxid_00);
  _local_1e8 = (undefined1  [16])0x0;
  local_460._0_8_ = "orphanage.HaveTx(normal_wtxid)";
  local_460.m_message.px = (element_type *)0xec05be;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_490 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_460;
  local_1f0[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_58,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_498,0x10a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 8));
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x10b;
  file_10.m_begin = (iterator)&local_4a8;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4b8,
             msg_10);
  bVar5 = TxOrphanage::HaveTx((TxOrphanage *)local_1d0,wtxid);
  local_1f0[0] = (class_property<bool>)(class_property<bool>)!bVar5;
  _local_1e8 = (undefined1  [16])0x0;
  local_460._0_8_ = "!orphanage.HaveTx(mutated_wtxid)";
  local_460.m_message.px = (element_type *)0xec050b;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4c0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_460;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_58,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_4c8,0x10b);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 8));
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x10d;
  file_11.m_begin = (iterator)&local_4d8;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4e8,
             msg_11);
  local_460.m_message.px = (element_type *)(local_460.m_message._1_8_ << 8);
  local_460._0_8_ = &PTR__lazy_ostream_013ae088;
  local_460.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = "";
  local_2fc = TxOrphanage::EraseTx((TxOrphanage *)local_1d0,wtxid_00);
  local_464 = 1;
  local_208.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_2fc == 1);
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_218._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_218._8_8_ = "";
  local_220 = &local_2fc;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013ae248;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_220;
  local_228 = &local_464;
  local_1e8 = (undefined1  [8])(local_1e8._1_8_ << 8);
  local_1f0 = (undefined1  [8])&PTR__lazy_ostream_013ae248;
  asStack_1e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_1e0[1].pi_ = (sp_counted_base *)&local_228;
  pcVar14 = "orphanage.EraseTx(normal_wtxid)";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,(lazy_ostream *)&local_460,1,2,REQUIRE,0xec057f,(size_t)local_218,0x10d,
             &local_58,"1",(assertion_result *)local_1f0);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x10e;
  file_12.m_begin = (iterator)&local_4f8;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_508,
             msg_12);
  bVar5 = TxOrphanage::HaveTx((TxOrphanage *)local_1d0,wtxid_00);
  _local_1e8 = (undefined1  [16])0x0;
  local_460._0_8_ = "!orphanage.HaveTx(normal_wtxid)";
  local_460.m_message.px = (element_type *)0xec05be;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_510 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_460;
  local_1f0[0] = (class_property<bool>)(class_property<bool>)!bVar5;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_58,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_518,0x10e);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 8));
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x10f;
  file_13.m_begin = (iterator)&local_528;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_538,
             msg_13);
  bVar5 = TxOrphanage::HaveTx((TxOrphanage *)local_1d0,wtxid);
  local_1f0[0] = (class_property<bool>)(class_property<bool>)!bVar5;
  _local_1e8 = (undefined1  [16])0x0;
  local_460._0_8_ = "!orphanage.HaveTx(mutated_wtxid)";
  local_460.m_message.px = (element_type *)0xec050b;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_540 = "";
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_460;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_58,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_548,0x10f);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 8));
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)&local_98);
  if (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)
      local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,(long)local_238 - local_248._0_8_);
  }
  if (p_Stack_140 != (pointer)0x0) {
    operator_delete(p_Stack_140,local_138._8_8_ - (long)p_Stack_140);
  }
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
               *)(local_1d0 + 0x60));
  std::
  _Rb_tree<long,_std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>,_std::_Select1st<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<long,_std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>,_std::_Select1st<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>_>
               *)(local_1d0 + 0x30));
  std::
  _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
  ::~_Rb_tree((_Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
               *)local_1d0);
  ChaCha20::~ChaCha20(&local_120.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(same_txid_diff_witness)
{
    FastRandomContext det_rand{true};
    TxOrphanage orphanage;
    NodeId peer{0};

    std::vector<COutPoint> empty_outpoints;
    auto parent = MakeTransactionSpending(empty_outpoints, det_rand);

    // Create children to go into orphanage.
    auto child_normal = MakeTransactionSpending({{parent->GetHash(), 0}}, det_rand);
    auto child_mutated = MakeMutation(child_normal);

    const auto& normal_wtxid = child_normal->GetWitnessHash();
    const auto& mutated_wtxid = child_mutated->GetWitnessHash();
    BOOST_CHECK(normal_wtxid != mutated_wtxid);

    BOOST_CHECK(orphanage.AddTx(child_normal, peer));
    // EraseTx fails as transaction by this wtxid doesn't exist.
    BOOST_CHECK_EQUAL(orphanage.EraseTx(mutated_wtxid), 0);
    BOOST_CHECK(orphanage.HaveTx(normal_wtxid));
    BOOST_CHECK(!orphanage.HaveTx(mutated_wtxid));

    // Must succeed. Both transactions should be present in orphanage.
    BOOST_CHECK(orphanage.AddTx(child_mutated, peer));
    BOOST_CHECK(orphanage.HaveTx(normal_wtxid));
    BOOST_CHECK(orphanage.HaveTx(mutated_wtxid));

    // Outpoints map should track all entries: check that both are returned as children of the parent.
    std::set<CTransactionRef> expected_children{child_normal, child_mutated};
    BOOST_CHECK(EqualTxns(expected_children, orphanage.GetChildrenFromSamePeer(parent, peer)));

    // Erase by wtxid: mutated first
    BOOST_CHECK_EQUAL(orphanage.EraseTx(mutated_wtxid), 1);
    BOOST_CHECK(orphanage.HaveTx(normal_wtxid));
    BOOST_CHECK(!orphanage.HaveTx(mutated_wtxid));

    BOOST_CHECK_EQUAL(orphanage.EraseTx(normal_wtxid), 1);
    BOOST_CHECK(!orphanage.HaveTx(normal_wtxid));
    BOOST_CHECK(!orphanage.HaveTx(mutated_wtxid));
}